

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void test_multi_field_constructors<Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>>
               (void)

{
  Element_conflict EVar1;
  uint __tmp;
  Element_conflict local_1c0;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_m2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c3;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_v;
  undefined4 local_1ac;
  Element_conflict local_1a8;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_d;
  undefined **local_1a0;
  undefined1 local_198;
  undefined8 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  m_d.element_ = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x16a);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  m_v.element_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_60,0x16a,1,2,&m_d,"m_d",&m_v,"T(0)");
  m_v.element_ = Gudhi::persistence_fields::
                 Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
                 _get_value<int,void>(0x138e);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x16e);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_88 = "";
  m_c2.element_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_90,0x16e,1,2,&m_v,"m_v",&m_c2,"T(1)",1);
  m_c2.element_ =
       Gudhi::persistence_fields::
       Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
       _get_value<int,void>(0x138e);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x173);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  m_c3.element_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_c0,0x173,1,2,&m_c2,"m_c2",&m_c3,"T(1)");
  m_c3 = m_c2;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x175);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_e8 = "";
  m_m2.element_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_f0,0x175,1,2,&m_c3,"m_c3",&m_m2,"T(1)",1);
  m_m2.element_ =
       Gudhi::persistence_fields::
       Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
       _get_value<int,void>(0x138e);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x17a);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_118 = "";
  local_1c0 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_120,0x17a,1,2,&m_m2,"m_m2",&local_1c0,"T(1)");
  EVar1 = Gudhi::persistence_fields::
          Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
          _get_value<int,void>(0x138e);
  local_1c0 = Gudhi::persistence_fields::
              Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
              _get_value<int,void>(0x138d);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = EVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x181);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_148 = "";
  local_1ac = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_150,0x181,1,2,&local_1a8,"m_s2",&local_1ac,"T(1)",1);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x182);
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_00129ae8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_178 = "";
  local_1ac = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
            (&local_1a0,&local_180,0x182,1,2,&local_1c0,"m_s1",&local_1ac,"T(0)");
  return;
}

Assistant:

void test_multi_field_constructors() {
  using T = typename MF::Element;

  // default constructor
  MF m_d;
  BOOST_CHECK_EQUAL(m_d, T(0));

  // value constructor
  MF m_v(5006);
  BOOST_CHECK_EQUAL(m_v, T(1));

  // copy constructor
  MF m_c1(5006);
  MF m_c2 = m_c1;
  BOOST_CHECK_EQUAL(m_c2, T(1));
  MF m_c3(m_c2);
  BOOST_CHECK_EQUAL(m_c3, T(1));

  // move constructor
  MF m_m1(5006);
  MF m_m2(std::move(m_m1));
  BOOST_CHECK_EQUAL(m_m2, T(1));
  // BOOST_CHECK_EQUAL(m_m1, T(0));   //does not work on windows

  // swap
  MF m_s1(5006);
  MF m_s2(5005);
  swap(m_s1, m_s2);
  BOOST_CHECK_EQUAL(m_s2, T(1));
  BOOST_CHECK_EQUAL(m_s1, T(0));
}